

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

size_t slang::ast::countGenMembers(SyntaxNode *syntax)

{
  bool bVar1;
  IfGenerateSyntax *syntax_00;
  size_t sVar2;
  reference ppCVar3;
  SyntaxNode *in_RDI;
  CaseItemSyntax *item;
  iterator __end3;
  iterator __begin3;
  SyntaxList<slang::syntax::CaseItemSyntax> *__range3;
  size_t count_1;
  CaseGenerateSyntax *caseGen;
  size_t count;
  IfGenerateSyntax *ifGen;
  undefined4 in_stack_ffffffffffffffa8;
  SyntaxKind SVar4;
  SyntaxNode *in_stack_ffffffffffffffb0;
  span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxList<slang::syntax::CaseItemSyntax> *local_38;
  size_t local_30;
  CaseGenerateSyntax *local_28;
  size_t local_20;
  SyntaxNode *in_stack_ffffffffffffffe8;
  size_t local_8;
  
  SVar4 = in_RDI->kind;
  if (SVar4 == CaseGenerate) {
    local_28 = slang::syntax::SyntaxNode::as<slang::syntax::CaseGenerateSyntax>(in_RDI);
    local_30 = 0;
    local_38 = &local_28->items;
    local_40._M_current =
         (CaseItemSyntax **)
         std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::begin
                   ((span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL> *)
                    CONCAT44(SVar4,in_stack_ffffffffffffffa8));
    std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>::end
              (in_stack_ffffffffffffffb8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                        ((__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                          *)in_stack_ffffffffffffffb0,
                         (__normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                          *)CONCAT44(SVar4,in_stack_ffffffffffffffa8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppCVar3 = __gnu_cxx::
                __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
                ::operator*(&local_40);
      in_stack_ffffffffffffffb0 = &(*ppCVar3)->super_SyntaxNode;
      if (in_stack_ffffffffffffffb0->kind == DefaultCaseItem) {
        slang::syntax::SyntaxNode::as<slang::syntax::DefaultCaseItemSyntax>
                  (in_stack_ffffffffffffffb0);
        not_null<slang::syntax::SyntaxNode_*>::operator*
                  ((not_null<slang::syntax::SyntaxNode_*> *)0x762d2a);
        sVar2 = countGenMembers(in_stack_ffffffffffffffe8);
        local_30 = sVar2 + local_30;
      }
      else {
        slang::syntax::SyntaxNode::as<slang::syntax::StandardCaseItemSyntax>
                  (in_stack_ffffffffffffffb0);
        not_null<slang::syntax::SyntaxNode_*>::operator*
                  ((not_null<slang::syntax::SyntaxNode_*> *)0x762d00);
        sVar2 = countGenMembers(in_stack_ffffffffffffffe8);
        local_30 = sVar2 + local_30;
      }
      __gnu_cxx::
      __normal_iterator<slang::syntax::CaseItemSyntax_**,_std::span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>_>
      ::operator++(&local_40);
    }
    local_8 = local_30;
  }
  else if (SVar4 == IfGenerate) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::IfGenerateSyntax>(in_RDI);
    not_null<slang::syntax::MemberSyntax_*>::operator*
              ((not_null<slang::syntax::MemberSyntax_*> *)0x762c10);
    local_20 = countGenMembers((SyntaxNode *)syntax_00);
    if (syntax_00->elseClause != (ElseClauseSyntax *)0x0) {
      not_null<slang::syntax::SyntaxNode_*>::operator*
                ((not_null<slang::syntax::SyntaxNode_*> *)0x762c41);
      sVar2 = countGenMembers((SyntaxNode *)syntax_00);
      local_20 = sVar2 + local_20;
    }
    local_8 = local_20;
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static size_t countGenMembers(const SyntaxNode& syntax) {
    switch (syntax.kind) {
        case SyntaxKind::IfGenerate: {
            auto& ifGen = syntax.as<IfGenerateSyntax>();
            size_t count = countGenMembers(*ifGen.block);
            if (ifGen.elseClause)
                count += countGenMembers(*ifGen.elseClause->clause);

            return count;
        }
        case SyntaxKind::CaseGenerate: {
            auto& caseGen = syntax.as<CaseGenerateSyntax>();
            size_t count = 0;
            for (auto item : caseGen.items) {
                switch (item->kind) {
                    case SyntaxKind::StandardCaseItem:
                        count += countGenMembers(*item->as<StandardCaseItemSyntax>().clause);
                        break;
                    case SyntaxKind::DefaultCaseItem:
                        count += countGenMembers(*item->as<DefaultCaseItemSyntax>().clause);
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            return count;
        }
        default: {
            return 1;
        }
    }
}